

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O1

void __thiscall
de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::reset
          (UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *this)

{
  BufferWithMemory *pBVar1;
  Allocation *pAVar2;
  VkBuffer obj;
  
  pBVar1 = (this->m_data).ptr;
  if (pBVar1 != (BufferWithMemory *)0x0) {
    pAVar2 = (pBVar1->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    if (pAVar2 != (Allocation *)0x0) {
      (*pAVar2->_vptr_Allocation[1])();
      (pBVar1->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)0x0;
    }
    obj.m_internal =
         (pBVar1->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&(pBVar1->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 obj);
    }
    (pBVar1->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    (pBVar1->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (pBVar1->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    (pBVar1->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    operator_delete(pBVar1,0x30);
    (this->m_data).ptr = (BufferWithMemory *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}